

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void duckdb_je_arena_dalloc_promoted(tsdn_t *tsdn,void *ptr,tcache_t *tcache,_Bool slow_path)

{
  rtree_ctx_cache_elm_t *prVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined5 uVar4;
  long lVar5;
  ulong *puVar6;
  rtree_leaf_elm_t *prVar7;
  void *pvVar8;
  uintptr_t extraout_RDX;
  uintptr_t uVar9;
  long lVar10;
  rtree_ctx_cache_elm_t *prVar11;
  rtree_ctx_cache_elm_t *prVar12;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t rStack_198;
  
  rtree_ctx = &rStack_198;
  if (tsdn == (tsdn_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(&rStack_198);
  }
  else {
    rtree_ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  pvVar8 = (void *)((ulong)ptr & 0xffffffffc0000000);
  prVar7 = (rtree_leaf_elm_t *)(ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  uVar9 = *(uintptr_t *)((long)&rtree_ctx->cache[0].leafkey + (long)&(prVar7->le_bits).repr);
  prVar12 = rtree_ctx->l2_cache + 1;
  if ((void *)rtree_ctx->l2_cache[1].leafkey == pvVar8) goto LAB_01d8f5b3;
  lVar5 = 1;
  prVar11 = prVar12;
  do {
    lVar10 = lVar5;
    if (lVar10 == 7) goto LAB_01d8f595;
    prVar12 = prVar11 + 1;
    prVar1 = prVar11 + 1;
    lVar5 = lVar10 + 1;
    prVar11 = prVar12;
  } while ((void *)prVar1->leafkey != pvVar8);
  do {
    puVar6 = (ulong *)((long)&(prVar7->le_bits).repr + (long)&rtree_ctx->cache[0].leafkey);
    prVar7 = prVar12->leaf;
    prVar11 = rtree_ctx->l2_cache + lVar10;
    uVar2 = *(undefined1 *)((long)&prVar11->leafkey + 1);
    uVar3 = *(undefined1 *)((long)&prVar11->leafkey + 2);
    uVar4 = *(undefined5 *)((long)&prVar11->leafkey + 3);
    *(_Bool *)&prVar12->leafkey = (_Bool)*(undefined1 *)&prVar11->leafkey;
    *(undefined1 *)((long)&prVar12->leafkey + 1) = uVar2;
    *(undefined1 *)((long)&prVar12->leafkey + 2) = uVar3;
    *(undefined5 *)((long)&prVar12->leafkey + 3) = uVar4;
    prVar12->leaf = rtree_ctx->l2_cache[lVar10].leaf;
    rtree_ctx->l2_cache[lVar10].leafkey = uVar9;
    rtree_ctx->l2_cache[lVar10].leaf = (rtree_leaf_elm_t *)puVar6[1];
    *puVar6 = (ulong)pvVar8;
    puVar6[1] = (ulong)prVar7;
LAB_01d8f595:
    pvVar8 = ptr;
    prVar12 = (rtree_ctx_cache_elm_t *)tsdn;
    prVar7 = duckdb_je_rtree_leaf_elm_lookup_hard
                       (tsdn,&duckdb_je_arena_emap_global.rtree,rtree_ctx,(uintptr_t)ptr,true,false)
    ;
    uVar9 = extraout_RDX;
LAB_01d8f5b3:
    lVar10 = 0;
  } while( true );
}

Assistant:

void
arena_dalloc_promoted(tsdn_t *tsdn, void *ptr, tcache_t *tcache,
    bool slow_path) {
	edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);
	arena_dalloc_promoted_impl(tsdn, ptr, tcache, slow_path, edata);
}